

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

int checkEquivalence(Abc_Ntk_t *pNtk1,Vec_Int_t *matchedInputs1,Vec_Int_t *matchedOutputs1,
                    Abc_Ntk_t *pNtk2,Vec_Int_t *matchedInputs2,Vec_Int_t *matchedOutputs2)

{
  int iVar1;
  Vec_Ptr_t *iMatchPairs;
  Vec_Ptr_t *oMatchPairs;
  Abc_Obj_t *pAVar2;
  char *__s;
  int iVar3;
  
  iMatchPairs = Vec_PtrAlloc(pNtk1->vPis->nSize * 2);
  oMatchPairs = Vec_PtrAlloc(pNtk1->vPos->nSize * 2);
  for (iVar3 = 0; iVar3 < pNtk1->vPis->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(matchedInputs2,iVar3);
    pAVar2 = Abc_NtkPi(pNtk2,iVar1);
    Vec_PtrPush(iMatchPairs,pAVar2);
    iVar1 = Vec_IntEntry(matchedInputs1,iVar3);
    pAVar2 = Abc_NtkPi(pNtk1,iVar1);
    Vec_PtrPush(iMatchPairs,pAVar2);
  }
  for (iVar3 = 0; iVar3 < pNtk1->vPos->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(matchedOutputs2,iVar3);
    pAVar2 = Abc_NtkPo(pNtk2,iVar1);
    Vec_PtrPush(oMatchPairs,pAVar2);
    iVar1 = Vec_IntEntry(matchedOutputs1,iVar3);
    pAVar2 = Abc_NtkPo(pNtk1,iVar1);
    Vec_PtrPush(oMatchPairs,pAVar2);
  }
  iVar3 = Abc_NtkBmSat(pNtk1,pNtk2,iMatchPairs,oMatchPairs,(Vec_Int_t *)0x0,0);
  __s = "*** Circuits are equivalent ***";
  if (iVar3 == 0) {
    __s = "*** Circuits are NOT equivalent ***";
  }
  puts(__s);
  Vec_PtrFree(iMatchPairs);
  Vec_PtrFree(oMatchPairs);
  return iVar3;
}

Assistant:

int checkEquivalence( Abc_Ntk_t * pNtk1, Vec_Int_t* matchedInputs1, Vec_Int_t * matchedOutputs1,
                       Abc_Ntk_t * pNtk2, Vec_Int_t* matchedInputs2, Vec_Int_t * matchedOutputs2)
{    
    Vec_Ptr_t * iMatchPairs, * oMatchPairs;
    int i;
    int result;

    iMatchPairs = Vec_PtrAlloc( Abc_NtkPiNum( pNtk1 ) * 2);
    oMatchPairs = Vec_PtrAlloc( Abc_NtkPoNum( pNtk1 ) * 2);

    for(i = 0; i < Abc_NtkPiNum(pNtk1); i++)
    {    
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i)));
        Vec_PtrPush(iMatchPairs, Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i)));
    }
                

    for(i = 0; i < Abc_NtkPoNum(pNtk1); i++)        
    {
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i)));
        Vec_PtrPush(oMatchPairs, Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i)));
    }        

    result = Abc_NtkBmSat(pNtk1, pNtk2, iMatchPairs, oMatchPairs, NULL, 0);

    if( result )
        printf("*** Circuits are equivalent ***\n");
    else
        printf("*** Circuits are NOT equivalent ***\n");

    Vec_PtrFree( iMatchPairs );
    Vec_PtrFree( oMatchPairs );    

    return result;
}